

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexMCMC.h
# Opt level: O1

Estimates * VertexMCMC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  EdgeIdx *pEVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  result_type rVar8;
  ulong uVar9;
  result_type rVar10;
  ulong uVar11;
  ulong *puVar12;
  size_t __i;
  long lVar13;
  size_type sVar14;
  unsigned_long uVar15;
  ulong uVar16;
  Estimates *pEVar17;
  unsigned_long uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_type sVar23;
  double dVar24;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> dist_parent_nbor;
  uniform_int_distribution<long> dist_nbor;
  mt19937 mt;
  random_device rd;
  double local_3cc0;
  double local_3cb8;
  vector<bool,_std::allocator<bool>_> local_3cb0;
  vector<bool,_std::allocator<bool>_> local_3c88;
  size_type local_3c60;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_3c58;
  Estimates *local_3c38;
  Parameters *local_3c30;
  size_type local_3c28;
  long local_3c20;
  ulong local_3c18;
  ulong local_3c10;
  Estimates local_3c08;
  OrderedEdgeCollection local_3be8;
  Parameters local_3b70;
  undefined1 local_3ac8 [16];
  ulong local_3ab8;
  unsigned_long uStack_3ab0;
  vector<bool,_std::allocator<bool>_> local_3aa8;
  vector<bool,_std::allocator<bool>_> local_3a80;
  unsigned_long local_3a58;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  sVar23 = cg->nVertices;
  local_3c28 = cg->nEdges;
  uVar16 = params->walk_length;
  uVar7 = *(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3c38 = __return_storage_ptr__;
  local_3c30 = params;
  std::random_device::random_device(&local_13b8);
  uVar6 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar6;
  lVar13 = 1;
  uVar21 = local_2740._M_x[0];
  do {
    uVar21 = (ulong)(((uint)(uVar21 >> 0x1e) ^ (uint)uVar21) * 0x6c078965 + (int)lVar13);
    local_2740._M_x[lVar13] = uVar21;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x270);
  local_2740._M_p = 0x270;
  local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (OrderedEdge *)0x0;
  local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (OrderedEdge *)0x0;
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3c88,sVar23,(bool *)local_3ac8,(allocator_type *)&local_3cb0);
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3cb0,local_3c28,(bool *)local_3ac8,(allocator_type *)&local_3c08);
  local_3c60 = sVar23;
  if (cg->offsets[uVar7 + 1] == cg->offsets[uVar7]) {
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_3ac8,&local_2740,5000);
    local_3c08.fraction_of_vertices_seen = (double)(cg->nVertices + -1);
    local_3c08.estimate = 0.0;
    uVar6 = 0;
    do {
      printf("BAd luck! Trying again %d\n",(ulong)uVar6);
      uVar7 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c08,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_3ac8,(param_type *)&local_3c08);
      if (0x3e6 < uVar6) break;
      uVar6 = uVar6 + 1;
    } while (cg->offsets[uVar7 + 1] == cg->offsets[uVar7]);
  }
  if ((long)uVar16 < 1) {
    local_3cc0 = 0.0;
    local_3cb8 = 0.0;
  }
  else {
    local_3c20 = uVar16 * 4;
    lVar13 = 0;
    local_3c18 = uVar16;
    do {
      pEVar1 = cg->offsets;
      uVar15 = pEVar1[uVar7 + 1] - pEVar1[uVar7];
      local_3c08.estimate = 0.0;
      lVar2 = pEVar1[uVar7];
      local_3c10 = uVar16;
      local_3c08.fraction_of_vertices_seen = (double)(uVar15 - 1);
      rVar8 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c08,&local_2740,
                         (param_type *)&local_3c08);
      uVar21 = rVar8 + lVar2;
      uVar16 = cg->nbors[uVar21];
      uVar18 = cg->offsets[uVar16 + 1] - cg->offsets[uVar16];
      local_3ac8._0_8_ = uVar7;
      local_3ac8._8_8_ = uVar16;
      local_3ab8 = uVar21;
      uStack_3ab0 = uVar15;
      if (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  (&local_3c58,
                   (iterator)
                   local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish,(OrderedEdge *)local_3ac8);
      }
      else {
        (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->index = uVar21;
        (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->degree = uVar15;
        (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->u = uVar7;
        (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->v = uVar16;
        local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar7 + 0x3f;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar7 & 0x3f);
      uVar9 = uVar16 + 0x3f;
      if (-1 < (long)uVar16) {
        uVar9 = uVar16;
      }
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar16 & 0x3f);
      uVar9 = uVar21 + 0x3f;
      if (-1 < (long)uVar21) {
        uVar9 = uVar21;
      }
      local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar21 & 0x3f);
      bVar5 = true;
      if (uVar15 != 1) {
        dVar24 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_2740);
        bVar5 = dVar24 < (double)(long)(uVar18 - 1) / (double)(long)(uVar15 - 1);
      }
      if (!bVar5) {
        uVar18 = uVar15;
        uVar16 = uVar7;
      }
      uVar7 = uVar16;
      local_3ac8._8_8_ = uVar18 - 1;
      local_3ac8._0_8_ = 0;
      lVar2 = cg->offsets[uVar7];
      rVar8 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)local_3ac8,&local_2740,
                         (param_type *)local_3ac8);
      lVar3 = cg->offsets[uVar7];
      rVar10 = std::uniform_int_distribution<long>::operator()
                         ((uniform_int_distribution<long> *)local_3ac8,&local_2740,
                          (param_type *)local_3ac8);
      uVar22 = rVar8 + lVar2;
      uVar20 = rVar10 + lVar3;
      uVar16 = cg->nbors[uVar22];
      uVar21 = cg->nbors[uVar20];
      uVar11 = Escape::CGraph::getEdgeBinary(cg,uVar16,uVar21);
      uVar9 = uVar16 + 0x3f;
      if (-1 < (long)uVar16) {
        uVar9 = uVar16;
      }
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar16 & 0x3f);
      uVar9 = uVar21 + 0x3f;
      if (-1 < (long)uVar21) {
        uVar9 = uVar21;
      }
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar21 & 0x3f);
      uVar9 = uVar22 + 0x3f;
      if (-1 < (long)uVar22) {
        uVar9 = uVar22;
      }
      local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar22 & 0x3f);
      uVar9 = uVar20 + 0x3f;
      if (-1 < (long)uVar20) {
        uVar9 = uVar20;
      }
      local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar9 >> 6) + ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) + ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar20 & 0x3f);
      if (uVar11 != 0xffffffffffffffff) {
        uVar9 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar9 = uVar11;
        }
        local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar9 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar9 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)uVar11 & 0x3f);
      }
      lVar13 = lVar13 + (ulong)(uVar16 != uVar21 && uVar11 != 0xffffffffffffffff);
      uVar16 = local_3c10 - 1;
    } while (uVar16 != 0);
    local_3cb8 = (double)lVar13;
    local_3cc0 = (double)local_3c20 * 100.0;
    uVar16 = local_3c18;
  }
  if (local_3c30->normalization_count_available == true) {
    sVar23 = local_3c60;
    pEVar17 = local_3c38;
    if ((long)local_3c60 < 1) {
      dVar24 = 0.0;
    }
    else {
      dVar24 = 0.0;
      sVar14 = 0;
      do {
        lVar13 = cg->offsets[sVar14 + 1] - cg->offsets[sVar14];
        dVar24 = dVar24 + (double)((lVar13 + -1) * lVar13) * 0.5;
        sVar14 = sVar14 + 1;
      } while (local_3c60 != sVar14);
    }
  }
  else {
    local_3ac8._0_8_ = uVar16;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8),&local_3c58);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3aa8,&local_3cb0);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3a80,&local_3c88);
    local_3a58 = 0;
    local_3be8.no_of_edges = local_3ac8._0_8_;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_3be8.edge_list,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8));
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3be8.visited_edge_set,&local_3aa8);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3be8.visited_vertex_set,&local_3a80);
    local_3be8.no_of_query = local_3a58;
    Parameters::Parameters(&local_3b70,local_3c30);
    sVar23 = local_3c60;
    DegreeSumSquare(&local_3c08,cg,&local_3be8,&local_3b70,0x19);
    pEVar17 = local_3c38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.out_directory._M_dataplus._M_p != &local_3b70.out_directory.field_2) {
      operator_delete(local_3b70.out_directory._M_dataplus._M_p,
                      local_3b70.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.algo_name._M_dataplus._M_p != &local_3b70.algo_name.field_2) {
      operator_delete(local_3b70.algo_name._M_dataplus._M_p,
                      local_3b70.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.filename._M_dataplus._M_p != &local_3b70.filename.field_2) {
      operator_delete(local_3b70.filename._M_dataplus._M_p,
                      local_3b70.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3be8.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3be8.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3be8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3be8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar24 = local_3c08.estimate;
    if (local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if ((void *)local_3ac8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_3ac8._8_8_,uStack_3ab0 - local_3ac8._8_8_);
    }
  }
  pEVar17->fraction_of_vertices_seen = 1.0;
  pEVar17->fraction_of_edges_seen = 1.0;
  pEVar17->query_complexity = 1.0;
  pEVar17->estimate = ((local_3cb8 / (double)(long)uVar16) * dVar24) / 3.0;
  dVar4 = 0.0;
  dVar24 = 0.0;
  if (local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar13 = 0;
    uVar16 = 0;
    puVar12 = local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar13 = lVar13 + (ulong)((*puVar12 >> (uVar16 & 0x3f) & 1) != 0);
      iVar19 = (int)uVar16;
      puVar12 = puVar12 + (iVar19 == 0x3f);
      uVar16 = (ulong)(iVar19 + 1);
      if (iVar19 == 0x3f) {
        uVar16 = 0;
      }
    } while ((uint)uVar16 !=
             local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar12 !=
             local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
    dVar24 = (double)lVar13 * 100.0;
  }
  if (local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar13 = 0;
    uVar16 = 0;
    puVar12 = local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar13 = lVar13 + (ulong)((*puVar12 >> (uVar16 & 0x3f) & 1) != 0);
      iVar19 = (int)uVar16;
      puVar12 = puVar12 + (iVar19 == 0x3f);
      uVar16 = (ulong)(iVar19 + 1);
      if (iVar19 == 0x3f) {
        uVar16 = 0;
      }
    } while ((uint)uVar16 !=
             local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar12 !=
             local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
    dVar4 = (double)lVar13 * 100.0;
  }
  pEVar17->fraction_of_vertices_seen = dVar4 / (double)(long)sVar23;
  pEVar17->fraction_of_edges_seen = dVar24 / (double)(long)local_3c28;
  pEVar17->query_complexity = local_3cc0 / (double)(long)local_3c28;
  if (local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_3cb0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_3c88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c58.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return pEVar17;
}

Assistant:

Estimates VertexMCMC(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    EdgeIdx count_tri = 0; // This variable counts the number of times we find a triangle
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    /**
     * Algorithm
     */
    parent = seed;
    deg_of_parent = cg->degree(parent); // degree of parent vertex
    if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
        parent = AlternateSeed(cg,mt);

    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the seed vertex
        deg_of_parent = cg->degree(parent); // degree of parent vertex
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        child = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
        deg_of_child = cg->degree(child);// degree of the child vertex

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[parent] = true;
        visited_vertex_set[child] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Decide if to take the step or stay put at the same vertex
         */
        bool accept;
        double acceptance_prob;
        if (deg_of_parent == 1)
            accept = true;
        else {
            acceptance_prob = (deg_of_child - 1) * 1.0 / (deg_of_parent - 1);
            std::bernoulli_distribution accpet_dist(acceptance_prob);
            accept = accpet_dist(mt);
        }
        if (accept) {
            parent = child;
            deg_of_parent = deg_of_child;
        }

        /**
         * Sample two nodes from the the neighborhood of parent. Call them u and v. Check if they form a triangle
         */
        std::uniform_int_distribution<VertexIdx> dist_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge_u = cg->offsets[parent] + dist_nbor(mt); // TODO: check randomness. same seeding ok?
        EdgeIdx random_nbor_edge_v = cg->offsets[parent] + dist_nbor(mt);
        no_of_query = no_of_query + 2; // Two queries to the uniform random neighbor oracle
        VertexIdx u = cg->nbors[random_nbor_edge_u];
        VertexIdx v = cg->nbors[random_nbor_edge_v];
        EdgeIdx e = cg->getEdgeBinary(u,v);
        no_of_query++; // One query to the edge oracle
        if( u!=v && e != -1) {// parent,u,v forms a triangle
            count_tri++;
        }

        /**
         * Update data structures
         */
        visited_vertex_set[u] = true;
        visited_vertex_set[v] = true;
        visited_edge_set[random_nbor_edge_u] = true;
        visited_edge_set[random_nbor_edge_v] = true;
        if (e!= -1)
            visited_edge_set[e] =true;

    }

    /**
     * Estimate the number of wedge count. This will be used in the triangle estimation.
     */
    double wedge_count = 0;
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates degree_sum_sq_output = DegreeSumSquare(cg, randomEdgeCollection, params, skip);
        wedge_count = degree_sum_sq_output.estimate;
    }
    else {
        for (VertexIdx src=0; src < n; src++) {
            VertexIdx deg = cg->degree(src);
            wedge_count += deg * (deg-1) * 0.5;
        }
    }

    double transitivity = 1.0*count_tri / walk_length;
    double triangleEstimate = transitivity * wedge_count / 3.0 ;

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query *100.0 /m;

    return return_estimate;
}